

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

aiReturn aiGetMaterialIntegerArray
                   (aiMaterial *pMat,char *pKey,uint type,uint index,int *pOut,uint *pMax)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  Logger *this;
  long *plVar4;
  char *pcVar5;
  long *plVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  aiMaterialProperty *prop;
  allocator local_89;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  aiMaterialProperty *local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (pOut == (int *)0x0) {
    __assert_fail("pOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0xbb,
                  "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                 );
  }
  if (pMat == (aiMaterial *)0x0) {
    __assert_fail("pMat != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0xbc,
                  "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                 );
  }
  aiGetMaterialProperty(pMat,pKey,type,index,&local_48);
  if (local_48 == (aiMaterialProperty *)0x0) {
    return aiReturn_FAILURE;
  }
  if (local_48->mType - aiPTI_Integer < 2) {
    uVar2 = local_48->mDataLength;
    uVar3 = 1;
    if (3 < uVar2) {
      uVar3 = uVar2 >> 2;
    }
    if ((pMax != (uint *)0x0) && (*pMax <= uVar3)) {
      uVar3 = *pMax;
    }
    if (uVar2 == 1) {
      *pOut = (int)*local_48->mData;
    }
    else if (uVar3 != 0) {
      uVar7 = 0;
      do {
        pOut[uVar7] = *(int *)(local_48->mData + uVar7 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
  }
  else {
    if (local_48->mType != aiPTI_Float) {
      if (pMax == (uint *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *pMax;
      }
      if (local_48->mDataLength < 5) {
        __assert_fail("prop->mDataLength >= 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                      ,0xec,
                      "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                     );
      }
      if (local_48->mData[local_48->mDataLength - 1] != '\0') {
        __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                      ,0xed,
                      "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                     );
      }
      pcVar5 = local_48->mData + 4;
      uVar7 = 0;
      while( true ) {
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + ((cVar1 - 0x2bU & 0xfd) == 0);
        cVar8 = *pcVar5;
        if ((byte)(cVar8 - 0x3aU) < 0xf6) {
          iVar10 = 0;
        }
        else {
          iVar10 = 0;
          do {
            iVar10 = (uint)(byte)(cVar8 - 0x30) + iVar10 * 10;
            cVar8 = pcVar5[1];
            pcVar5 = pcVar5 + 1;
          } while (0xf5 < (byte)(cVar8 - 0x3aU));
        }
        iVar9 = -iVar10;
        if (cVar1 != '-') {
          iVar9 = iVar10;
        }
        pOut[uVar7] = iVar9;
        if (uVar7 == uVar3 - 1) break;
        if ((*pcVar5 != '\t') && (*pcVar5 != ' ')) {
          this = Assimp::DefaultLogger::get();
          std::__cxx11::string::string((string *)local_40,pKey,&local_89);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x777723);
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_58 = *plVar6;
            lStack_50 = plVar4[3];
            local_68 = &local_58;
          }
          else {
            local_58 = *plVar6;
            local_68 = (long *)*plVar4;
          }
          local_60 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_78 = *plVar6;
            lStack_70 = plVar4[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar6;
            local_88 = (long *)*plVar4;
          }
          local_80 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          Assimp::Logger::error(this,(char *)local_88);
          if (local_88 != &local_78) {
            operator_delete(local_88);
          }
          if (local_68 != &local_58) {
            operator_delete(local_68);
          }
          if (local_40[0] == local_30) {
            return aiReturn_FAILURE;
          }
          operator_delete(local_40[0]);
          return aiReturn_FAILURE;
        }
        uVar7 = uVar7 + 1;
      }
      if (pMax != (uint *)0x0) {
        *pMax = uVar3;
      }
      if (uVar7 == uVar3 - 1) {
        return aiReturn_SUCCESS;
      }
      return aiReturn_FAILURE;
    }
    uVar3 = local_48->mDataLength >> 2;
    if ((pMax != (uint *)0x0) && (*pMax <= uVar3)) {
      uVar3 = *pMax;
    }
    if (uVar3 != 0) {
      uVar7 = 0;
      do {
        pOut[uVar7] = (int)*(float *)(local_48->mData + uVar7 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
  }
  if (pMax != (uint *)0x0) {
    *pMax = uVar3;
  }
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn aiGetMaterialIntegerArray(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    int* pOut,
    unsigned int* pMax)
{
    ai_assert( pOut != NULL );
    ai_assert( pMat != NULL );

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index,(const aiMaterialProperty**) &prop);
    if (!prop) {
        return AI_FAILURE;
    }

    // data is given in ints, simply copy it
    unsigned int iWrite = 0;
    if( aiPTI_Integer == prop->mType || aiPTI_Buffer == prop->mType)    {
        iWrite = std::max(static_cast<unsigned int>(prop->mDataLength / sizeof(int32_t)), 1u);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite);
        }
        if (1 == prop->mDataLength) {
            // bool type, 1 byte
            *pOut = static_cast<int>(*prop->mData);
        }
        else {
            for (unsigned int a = 0; a < iWrite;++a) {
                pOut[a] = static_cast<int>(reinterpret_cast<int32_t*>(prop->mData)[a]);
            }
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in floats convert to int
    else if( aiPTI_Float == prop->mType)    {
        iWrite = prop->mDataLength / sizeof(float);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a) {
            pOut[a] = static_cast<int>(reinterpret_cast<float*>(prop->mData)[a]);
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // it is a string ... no way to read something out of this
    else    {
        if (pMax) {
            iWrite = *pMax;
        }
        // strings are zero-terminated with a 32 bit length prefix, so this is safe
        const char *cur =  prop->mData+4;
        ai_assert( prop->mDataLength >= 5 );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        for (unsigned int a = 0; ;++a) {
            pOut[a] = strtol10(cur,&cur);
            if(a==iWrite-1) {
                break;
            }
            if(!IsSpace(*cur)) {
                ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
                    " is a string; failed to parse an integer array out of it.");
                return AI_FAILURE;
            }
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    return AI_SUCCESS;
}